

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfContext.cpp
# Opt level: O0

exr_attribute_t * __thiscall Imf_3_4::Context::getAttr(Context *this,int partidx,int attridx)

{
  int iVar1;
  element_type *pp_Var2;
  ostream *poVar3;
  char *pcVar4;
  ArgExc *this_00;
  int in_EDX;
  int in_ESI;
  stringstream _iex_throw_s;
  exr_attribute_t *attr;
  __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_fffffffffffffe10;
  stringstream local_1a0 [16];
  ostream local_190 [320];
  Context *in_stack_ffffffffffffffb0;
  exr_attribute_t *local_18;
  int local_10;
  int local_c;
  
  local_18 = (exr_attribute_t *)0x0;
  local_10 = in_EDX;
  local_c = in_ESI;
  pp_Var2 = std::
            __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator*(in_stack_fffffffffffffe10);
  iVar1 = exr_get_attribute_by_index(*pp_Var2,local_c,0,local_10,&local_18);
  if (iVar1 != 0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1a0);
    poVar3 = std::operator<<(local_190,"Unable to get attribute index ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_10);
    poVar3 = std::operator<<(poVar3," for part ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_c);
    poVar3 = std::operator<<(poVar3," in file \'");
    pcVar4 = fileName(in_stack_ffffffffffffffb0);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::operator<<(poVar3,"\'");
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(this_00,local_1a0);
    __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  return local_18;
}

Assistant:

const exr_attribute_t*
Context::getAttr (int partidx, int attridx) const
{
    const exr_attribute_t* attr = nullptr;

    if (EXR_ERR_SUCCESS !=
        exr_get_attribute_by_index (
            *_ctxt, partidx, EXR_ATTR_LIST_FILE_ORDER, attridx, &attr))
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Unable to get attribute index " << attridx << " for part "
                                             << partidx << " in file '"
                                             << fileName () << "'");
    }

    return attr;
}